

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O1

bool __thiscall
sc_dt::sc_uint_subref_r::concat_get_ctrl(sc_uint_subref_r *this,sc_digit *dst_p,int low_i)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = low_i / 0x1e;
  iVar2 = ((low_i + this->m_left) - this->m_right) / 0x1e;
  dst_p[(int)uVar1] =
       dst_p[(int)uVar1] & ~(uint)(-1L << ((char)uVar1 * -0x1e + (char)low_i & 0x3fU));
  if ((int)uVar1 < iVar2) {
    memset(dst_p + (long)(int)uVar1 + 1,0,(ulong)(iVar2 + ~uVar1) * 4 + 4);
  }
  return false;
}

Assistant:

bool sc_uint_subref_r::concat_get_ctrl( sc_digit* dst_p, int low_i ) const
{
    int       dst_i;	   // Word in dst_p now processing.
    int       end_i;	   // Highest order word in dst_p to process.
    int       left_shift;  // Left shift for val.
    uint_type mask;	   // Mask for bits to extract or keep.

    dst_i = low_i / BITS_PER_DIGIT;
    left_shift = low_i % BITS_PER_DIGIT;
    end_i = (low_i + (m_left-m_right)) / BITS_PER_DIGIT;

    mask = ~(~UINT_ZERO << left_shift);
    dst_p[dst_i] = (sc_digit)((dst_p[dst_i] & mask));

    dst_i++;
    for ( ; dst_i <= end_i; dst_i++ ) dst_p[dst_i] = 0;

    return false;
}